

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blendshape_fitting.hpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
eos::fitting::fit_blendshapes_to_landmarks_nnls
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
          *blendshapes,VectorXf *face_instance,Matrix<float,_3,_4,_0,_3,_4> *affine_camera_matrix,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *landmarks,vector<int,_std::allocator<int>_> *vertex_ids)

{
  Index *this;
  float fVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  const_reference pvVar7;
  Index IVar8;
  long lVar9;
  Scalar *v;
  DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *pDVar10;
  CoeffReturnType pfVar11;
  Scalar *pSVar12;
  CoeffReturnType pfVar13;
  MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *other;
  Scalar *__first;
  Scalar *pSVar14;
  Index IVar15;
  Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0> PVar16;
  Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> PVar17;
  allocator<float> local_379;
  Matrix<float,__1,_1,_0,__1,_1> *local_378;
  NegativeReturnType local_370;
  ColVectorType local_360;
  undefined1 local_349;
  undefined1 local_348 [7];
  bool non_singular;
  NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> nnls;
  VectorXf coefficients;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  local_258;
  undefined1 local_238 [8];
  MatrixXf b;
  undefined1 local_210 [8];
  MatrixXf A;
  DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> local_1f0 [4];
  int i_3;
  undefined1 local_1e0 [8];
  VectorXf v_bar;
  DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> local_1c8 [4];
  int i_2;
  undefined1 local_1b8 [8];
  VectorXf y;
  __normal_iterator<Eigen::Triplet<float,_int>_*,_std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>_>
  local_1a0;
  int local_198;
  int local_194;
  Triplet<float,_int> local_190;
  int local_184;
  int local_180;
  int y_1;
  int x;
  int i_1;
  vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> P_coefficients;
  SparseMatrix<float,_0,_int> P;
  Type local_e0;
  int local_a4;
  int local_a0;
  int i;
  int row_index;
  ConstantReturnType local_90;
  undefined1 local_78 [8];
  MatrixXf V_hat_h;
  MatrixXf blendshapes_as_basis;
  int num_landmarks;
  size_type num_blendshapes;
  vector<int,_std::allocator<int>_> *vertex_ids_local;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  *landmarks_local;
  Matrix<float,_3,_4,_0,_3,_4> *affine_camera_matrix_local;
  VectorXf *face_instance_local;
  vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
  *blendshapes_local;
  
  sVar5 = std::
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          ::size(landmarks);
  sVar6 = std::vector<int,_std::allocator<int>_>::size(vertex_ids);
  if (sVar5 == sVar6) {
    sVar5 = std::
            vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
            ::size(blendshapes);
    sVar6 = std::
            vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ::size(landmarks);
    iVar4 = (int)sVar6;
    morphablemodel::to_matrix
              ((MatrixXf *)
               &V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,blendshapes);
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Zero
              (&local_90,(long)(iVar4 << 2),sVar5);
    Eigen::Matrix<float,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
              ((Matrix<float,_1,_1,0,_1,_1> *)local_78,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                *)&local_90);
    local_a0 = 0;
    for (local_a4 = 0; local_a4 < iVar4; local_a4 = local_a4 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](vertex_ids,(long)local_a4);
      iVar2 = *pvVar7;
      this = &V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      IVar8 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)this);
      Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::block<int,long>
                (&local_e0,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)this,(long)(iVar2 * 3),0
                 ,3,IVar8);
      lVar9 = (long)local_a0;
      IVar8 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_78);
      Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::block<int,long>
                ((Type *)&P.m_data.m_allocatedSize,
                 (DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_78,lVar9,0,3,IVar8);
      Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false> *)&P.m_data.m_allocatedSize,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&local_e0);
      local_a0 = local_a0 + 4;
    }
    Eigen::SparseMatrix<float,_0,_int>::SparseMatrix
              ((SparseMatrix<float,_0,_int> *)
               &P_coefficients.
                super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(iVar4 * 3),
               (long)(iVar4 << 2));
    std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::vector
              ((vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> *)
               &x);
    for (y_1 = 0; y_1 < iVar4; y_1 = y_1 + 1) {
      local_180 = 0;
      while( true ) {
        lVar9 = (long)local_180;
        IVar8 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::rows
                          (&affine_camera_matrix->
                            super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>);
        if (IVar8 <= lVar9) break;
        local_184 = 0;
        while( true ) {
          lVar9 = (long)local_184;
          IVar8 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::cols
                            (&affine_camera_matrix->
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>);
          if (IVar8 <= lVar9) break;
          local_194 = y_1 * 3 + local_180;
          local_198 = local_184 + y_1 * 4;
          v = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>,_1> *)
                         affine_camera_matrix,(long)local_180,(long)local_184);
          Eigen::Triplet<float,_int>::Triplet(&local_190,&local_194,&local_198,v);
          std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::
          push_back((vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                     *)&x,&local_190);
          local_184 = local_184 + 1;
        }
        local_180 = local_180 + 1;
      }
    }
    local_1a0._M_current =
         (Triplet<float,_int> *)
         std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::
         begin((vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> *)
               &x);
    y.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)std::
                vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::
                end((vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                     *)&x);
    Eigen::SparseMatrix<float,0,int>::
    setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<float,int>*,std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>>>
              ((SparseMatrix<float,0,int> *)
               &P_coefficients.
                super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a0,
               (__normal_iterator<Eigen::Triplet<float,_int>_*,_std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>_>
                *)&y.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Ones(local_1c8,(long)(iVar4 * 3));
    Eigen::Matrix<float,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
              ((Matrix<float,_1,1,0,_1,1> *)local_1b8,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)local_1c8);
    for (v_bar.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
              = 0;
        v_bar.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ <
        iVar4; v_bar.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
               _4_4_ = v_bar.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
                       .m_rows._4_4_ + 1) {
      pDVar10 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                std::
                vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ::operator[](landmarks,
                             (long)v_bar.
                                   super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows._4_4_);
      pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                          (pDVar10,0);
      fVar1 = *pfVar11;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)local_1b8,
                           (long)(v_bar.
                                  super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_ * 3));
      *pSVar12 = fVar1;
      pDVar10 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                std::
                vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ::operator[](landmarks,
                             (long)v_bar.
                                   super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows._4_4_);
      pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                          (pDVar10,1);
      fVar1 = *pfVar11;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)local_1b8,
                           (long)(v_bar.
                                  super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_ * 3 + 1));
      *pSVar12 = fVar1;
    }
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::Ones(local_1f0,(long)(iVar4 << 2));
    Eigen::Matrix<float,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
              ((Matrix<float,_1,1,0,_1,1> *)local_1e0,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)local_1f0);
    for (A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ =
              0; A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
                 _4_4_ < iVar4;
        A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ =
             A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
             _4_4_ + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (vertex_ids,
                          (long)A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols._4_4_);
      pfVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)
                           face_instance,(long)(*pvVar7 * 3));
      fVar1 = *pfVar13;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)local_1e0,
                           (long)(A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols._4_4_ << 2));
      *pSVar12 = fVar1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (vertex_ids,
                          (long)A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols._4_4_);
      pfVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)
                           face_instance,(long)(*pvVar7 * 3 + 1));
      fVar1 = *pfVar13;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)local_1e0,
                           (long)(A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols._4_4_ * 4 + 1));
      *pSVar12 = fVar1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (vertex_ids,
                          (long)A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols._4_4_);
      pfVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)
                           face_instance,(long)(*pvVar7 * 3 + 2));
      fVar1 = *pfVar13;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)local_1e0,
                           (long)(A.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols._4_4_ * 4 + 2));
      *pSVar12 = fVar1;
    }
    PVar16 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<float,0,int>>::operator*
                       ((SparseMatrixBase<Eigen::SparseMatrix<float,0,int>> *)
                        &P_coefficients.
                         super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_78);
    b.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)PVar16.m_lhs;
    Eigen::Matrix<float,-1,-1,0,-1,-1>::
    Matrix<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
              ((Matrix<float,_1,_1,0,_1,_1> *)local_210,
               (EigenBase<Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
                *)&b.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                   m_cols);
    PVar17 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<float,0,int>>::operator*
                       ((SparseMatrixBase<Eigen::SparseMatrix<float,0,int>> *)
                        &P_coefficients.
                         super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_1e0);
    coefficients.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)PVar17.m_lhs;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,-1,1,0,-1,1>,0>>
    ::operator-(&local_258,
                (MatrixBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
                 *)&coefficients.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_1b8
               );
    Eigen::Matrix<float,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
              ((Matrix<float,_1,_1,0,_1,_1> *)local_238,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)&local_258);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<float,__1,_1,_0,__1,_1> *)
               &nnls._tempVector.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows);
    Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::NNLS
              ((NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_348,(MatrixType *)local_210,
               100,1e-10);
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::operator-
              (&local_370,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_238);
    Eigen::Matrix<float,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const>>
              ((Matrix<float,_1,1,0,_1,1> *)&local_360,
               (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                *)&local_370);
    bVar3 = Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::solve
                      ((NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_348,&local_360,
                       MAX_DESCENT);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix(&local_360);
    local_349 = bVar3;
    other = (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
            Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::x
                      ((NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_348);
    local_378 = (Matrix<float,__1,_1,_0,__1,_1> *)
                Eigen::MatrixBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::noalias
                          ((MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
                           &nnls._tempVector.
                            super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                            m_rows);
    Eigen::NoAlias<Eigen::Matrix<float,-1,1,0,-1,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::MatrixBase> *)&local_378,other);
    __first = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                        ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
                         &nnls._tempVector.
                          super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows);
    pSVar14 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                        ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
                         &nnls._tempVector.
                          super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows);
    IVar15 = Eigen::EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                       ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
                        &nnls._tempVector.
                         super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows);
    std::allocator<float>::allocator(&local_379);
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)__return_storage_ptr__,__first,
               pSVar14 + IVar15,&local_379);
    std::allocator<float>::~allocator(&local_379);
    Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~NNLS
              ((NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_348);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<float,__1,_1,_0,__1,_1> *)
               &nnls._tempVector.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows);
    Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_238);
    Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_210);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_1e0);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_1b8);
    std::vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>::~vector
              ((vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> *)
               &x);
    Eigen::SparseMatrix<float,_0,_int>::~SparseMatrix
              ((SparseMatrix<float,_0,_int> *)
               &P_coefficients.
                super__Vector_base<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_78);
    Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<float,__1,__1,_0,__1,__1> *)
               &V_hat_h.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols);
    return __return_storage_ptr__;
  }
  __assert_fail("landmarks.size() == vertex_ids.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/blendshape_fitting.hpp"
                ,0x8f,
                "std::vector<float> eos::fitting::fit_blendshapes_to_landmarks_nnls(const std::vector<morphablemodel::Blendshape> &, const Eigen::VectorXf &, Eigen::Matrix<float, 3, 4>, const std::vector<Eigen::Vector2f> &, const std::vector<int> &)"
               );
}

Assistant:

inline std::vector<float> fit_blendshapes_to_landmarks_nnls(
    const std::vector<morphablemodel::Blendshape>& blendshapes, const Eigen::VectorXf& face_instance,
    Eigen::Matrix<float, 3, 4> affine_camera_matrix, const std::vector<Eigen::Vector2f>& landmarks,
    const std::vector<int>& vertex_ids)
{
    assert(landmarks.size() == vertex_ids.size());

    using Eigen::MatrixXf;
    using Eigen::VectorXf;

    const auto num_blendshapes = blendshapes.size();
    const int num_landmarks = static_cast<int>(landmarks.size());

    // Copy all blendshapes into a "basis" matrix with each blendshape being a column:
    const MatrixXf blendshapes_as_basis = morphablemodel::to_matrix(blendshapes);

    // $\hat{V} \in R^{3N\times m-1}$, subselect the rows of the eigenvector matrix $V$ associated with the $N$ feature points
    // And we insert a row of zeros after every third row, resulting in matrix $\hat{V}_h \in R^{4N\times m-1}$:
    MatrixXf V_hat_h = MatrixXf::Zero(4 * num_landmarks, num_blendshapes);
    int row_index = 0;
    for (int i = 0; i < num_landmarks; ++i)
    {
        V_hat_h.block(row_index, 0, 3, V_hat_h.cols()) =
            blendshapes_as_basis.block(vertex_ids[i] * 3, 0, 3, blendshapes_as_basis.cols());
        row_index += 4; // replace 3 rows and skip the 4th one, it has all zeros
    }

    // Form a block diagonal matrix $P \in R^{3N\times 4N}$ in which the camera matrix C (P_Affine, affine_camera_matrix) is placed on the diagonal:
    Eigen::SparseMatrix<float> P(3 * num_landmarks, 4 * num_landmarks);
    std::vector<Eigen::Triplet<float>> P_coefficients; // list of non-zeros coefficients
    for (int i = 0; i < num_landmarks; ++i)
    { // Note: could make this the inner-most loop.
        for (int x = 0; x < affine_camera_matrix.rows(); ++x)
        {
            for (int y = 0; y < affine_camera_matrix.cols(); ++y)
            {
                P_coefficients.push_back(
                    Eigen::Triplet<float>(3 * i + x, 4 * i + y, affine_camera_matrix(x, y)));
            }
        }
    }
    P.setFromTriplets(P_coefficients.begin(), P_coefficients.end());

    // The landmarks in matrix notation (in homogeneous coordinates), $3N\times 1$
    VectorXf y = VectorXf::Ones(3 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        y(3 * i) = landmarks[i][0];
        y((3 * i) + 1) = landmarks[i][1];
        // y_((3 * i) + 2) = 1; // already 1, stays (homogeneous coordinate)
    }

    // The mean, with an added homogeneous coordinate (x_1, y_1, z_1, 1, x_2, ...)^t
    VectorXf v_bar = VectorXf::Ones(4 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        v_bar(4 * i) = face_instance(vertex_ids[i] * 3);
        v_bar((4 * i) + 1) = face_instance(vertex_ids[i] * 3 + 1);
        v_bar((4 * i) + 2) = face_instance(vertex_ids[i] * 3 + 2);
        // v_bar((4 * i) + 3) = 1; // already 1, stays (homogeneous coordinate)
    }

    // Bring into standard least squares form:
    const MatrixXf A = P * V_hat_h;   // camera matrix times the basis
    const MatrixXf b = P * v_bar - y; // camera matrix times the mean, minus the landmarks

    // Solve using NNLS:
    VectorXf coefficients;
    Eigen::NNLS<MatrixXf> nnls(A, 100); // In the multi-image fitting, the solver sometimes got stuck. This limits it to 100 iterations. It normaly converges within <10 iterations. This should be fine for the single-image fitting as well.
    bool non_singular = nnls.solve(-b);
    coefficients.noalias() = nnls.x();

    return std::vector<float>(coefficients.data(), coefficients.data() + coefficients.size());
}